

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderStateQueryTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::anon_unknown_0::CurrentVertexAttribUintCase::test
          (CurrentVertexAttribUintCase *this)

{
  ostringstream *this_00;
  TestContext *testCtx;
  CallLogWrapper *this_01;
  deUint32 dVar1;
  deUint32 dVar2;
  deUint32 dVar3;
  deUint32 dVar4;
  GLuint index;
  int attribute_count;
  StateQueryMemoryWriteGuard<unsigned_int[4]> attribValue;
  Random rnd;
  GLint local_20c;
  StateQueryMemoryWriteGuard<unsigned_int[4]> local_208;
  CallLogWrapper *local_1d0;
  CurrentVertexAttribUintCase *local_1c8;
  deRandom local_1c0;
  undefined1 local_1b0 [384];
  
  deRandom_init(&local_1c0,0xabcdef);
  local_20c = 0x10;
  local_1d0 = &(this->super_ApiCase).super_CallLogWrapper;
  local_1c8 = this;
  glu::CallLogWrapper::glGetIntegerv(local_1d0,0x8869,&local_20c);
  if (0 < local_20c) {
    index = 0;
    do {
      dVar1 = deRandom_getUint32(&local_1c0);
      dVar2 = deRandom_getUint32(&local_1c0);
      dVar3 = deRandom_getUint32(&local_1c0);
      dVar4 = deRandom_getUint32(&local_1c0);
      this_01 = local_1d0;
      glu::CallLogWrapper::glVertexAttribI4ui
                (local_1d0,index,dVar1 % 0xfa01,dVar2 % 0xfa01,dVar3 % 0xfa01,dVar4 % 0xfa01);
      testCtx = (local_1c8->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
      local_208.m_postguard[0] = 0xdededede;
      local_208.m_postguard[1] = 0xdededede;
      local_208.m_postguard[2] = 0xdededede;
      local_208.m_postguard[3] = 0xdededede;
      local_208.m_value[0] = 0xdededede;
      local_208.m_value[1] = 0xdededede;
      local_208.m_value[2] = 0xdededede;
      local_208.m_value[3] = 0xdededede;
      local_208.m_preguard[0] = 0xdededede;
      local_208.m_preguard[1] = 0xdededede;
      local_208.m_preguard[2] = 0xdededede;
      local_208.m_preguard[3] = 0xdededede;
      this_00 = (ostringstream *)(local_1b0 + 8);
      glu::CallLogWrapper::glGetVertexAttribIuiv(this_01,index,0x8626,local_208.m_value);
      deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_int[4]>::verifyValidity
                (&local_208,testCtx);
      if ((((local_208.m_value[0] != dVar1 % 0xfa01) || (local_208.m_value[1] != dVar2 % 0xfa01)) ||
          (local_208.m_value[2] != dVar3 % 0xfa01)) || (local_208.m_value[3] != dVar4 % 0xfa01)) {
        local_1b0._0_8_ = testCtx->m_log;
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,"// ERROR: Expected [",0x14);
        std::ostream::_M_insert<unsigned_long>((ulong)this_00);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,",",1);
        std::ostream::_M_insert<unsigned_long>((ulong)this_00);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,",",1);
        std::ostream::_M_insert<unsigned_long>((ulong)this_00);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,",",1);
        std::ostream::_M_insert<unsigned_long>((ulong)this_00);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"];",2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"got [",5);
        std::ostream::_M_insert<unsigned_long>((ulong)this_00);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,",",1);
        std::ostream::_M_insert<unsigned_long>((ulong)this_00);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,",",1);
        std::ostream::_M_insert<unsigned_long>((ulong)this_00);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,",",1);
        std::ostream::_M_insert<unsigned_long>((ulong)this_00);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"]",1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(this_00);
        std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
        if (testCtx->m_testResult == QP_TEST_RESULT_PASS) {
          tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"got invalid attribute value")
          ;
        }
      }
      index = index + 1;
    } while ((int)index < local_20c);
  }
  return;
}

Assistant:

void test (void)
	{
		using tcu::TestLog;

		de::Random rnd(0xabcdef);

		int attribute_count = 16;
		glGetIntegerv(GL_MAX_VERTEX_ATTRIBS, &attribute_count);

		// test write float/read float

		for (int index = 0; index < attribute_count; ++index)
		{
			const GLuint x = rnd.getInt(0, 64000);
			const GLuint y = rnd.getInt(0, 64000);
			const GLuint z = rnd.getInt(0, 64000);
			const GLuint w = rnd.getInt(0, 64000);

			glVertexAttribI4ui(index, x, y, z, w);
			verifyCurrentVertexAttribIui(m_testCtx, *this, index, x, y, z, w);
		}
	}